

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall
Search::search::set_label_parser(search *this,label_parser *lp,_func_bool_polylabel_ptr *is_test)

{
  ostream *this_00;
  undefined8 in_RDX;
  void *in_RSI;
  long *in_RDI;
  
  if (((*(byte *)(*(long *)*in_RDI + 0xd8) & 1) != 0) && (*(int *)(*in_RDI + 0x6c) != 0)) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "warning: task should not set label parser except in initialize function!"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  memcpy((void *)(*(long *)(*(long *)*in_RDI + 8) + 0x330),in_RSI,0x48);
  *(undefined8 *)(*(long *)(*(long *)*in_RDI + 8) + 0x368) = in_RDX;
  *(undefined8 *)(*in_RDI + 0x90) = in_RDX;
  return;
}

Assistant:

void search::set_label_parser(label_parser& lp, bool (*is_test)(polylabel&))
{
  if (this->priv->all->vw_is_main && (this->priv->state != INITIALIZE))
    std::cerr << "warning: task should not set label parser except in initialize function!" << endl;
  this->priv->all->p->lp = lp;
  this->priv->all->p->lp.test_label = (bool (*)(void*))is_test;
  this->priv->label_is_test = is_test;
}